

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost12sum.c
# Opt level: O3

void help(void)

{
  fwrite("Calculates GOST R 34.11-2012 hash function\n\n",0x2c,1,_stderr);
  fwrite("gost12sum [-vl] [-c [file]]| [files]|-x\n\t-c check message digests (default is generate)\n\t-v verbose, print file names when checking\n\t-l use 512 bit hash (default 256 bit)\n\t-x read filenames from stdin rather than from arguments (256 bit only)\n\t-h print this help\nThe input for -c should be the list of message digests and file names\nthat is printed on stdout by this program when it generates digests.\n"
         ,0x192,1,_stderr);
  exit(3);
}

Assistant:

void help()
{
    fprintf(stderr, "Calculates GOST R 34.11-2012 hash function\n\n");
    fprintf(stderr, "gost12sum [-vl] [-c [file]]| [files]|-x\n"
            "\t-c check message digests (default is generate)\n"
            "\t-v verbose, print file names when checking\n"
            "\t-l use 512 bit hash (default 256 bit)\n"
            "\t-x read filenames from stdin rather than from arguments (256 bit only)\n"
            "\t-h print this help\n"
            "The input for -c should be the list of message digests and file names\n"
            "that is printed on stdout by this program when it generates digests.\n");
    exit(3);
}